

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QByteArray>>
          (QtPrivate *this,QDebug debug,char *which,QList<QByteArray> *c)

{
  QByteArray *pQVar1;
  long lVar2;
  QString *pQVar3;
  QList<QByteArray> *pQVar4;
  QByteArray *pQVar5;
  QString *this_00;
  char *pcVar6;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar7[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar3 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar3->d).d + 1);
      pcVar6 = which + 1 + (long)pQVar3;
      pQVar3 = this_00;
    } while (*pcVar6 != '\0');
  }
  ba.m_data = (storage_type *)pQVar4;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar7,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ::QTextStream::operator<<(pQVar7,'(');
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
  }
  pQVar1 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar5 = pQVar1;
  if (lVar2 != 0) {
    pcVar6 = (pQVar1->d).ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &QByteArray::_empty;
    }
    pQVar4 = (QList<QByteArray> *)0x0;
    QDebug::putByteArray((QDebug *)debug.stream,pcVar6,(pQVar1->d).size,ContainsBinary);
    pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar7,' ');
    }
    pQVar5 = pQVar1 + 1;
  }
  if (pQVar5 != pQVar1 + lVar2) {
    do {
      pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = (storage_type *)pQVar4;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar7,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar7,' ');
      }
      pcVar6 = (pQVar5->d).ptr;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = &QByteArray::_empty;
      }
      pQVar4 = (QList<QByteArray> *)0x0;
      QDebug::putByteArray((QDebug *)debug.stream,pcVar6,(pQVar5->d).size,ContainsBinary);
      pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar7,' ');
      }
      pQVar5 = pQVar5 + 1;
    } while (pQVar5 != pQVar1 + lVar2);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(QTextStream **)this = pQVar7;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}